

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

char * transform_xml2json(ly_ctx *ctx,char *expr,lyxml_elem *xml,int use_ctx_data_clb,int log)

{
  char *pcVar1;
  lyxp_expr *expr_00;
  lyxml_ns *plVar2;
  lys_module *plVar3;
  ushort **ppuVar4;
  size_t sVar5;
  LY_ERR *pLVar6;
  int iVar7;
  char cVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  size_t local_80;
  char *local_58;
  
  local_80 = strlen(expr);
  local_80 = local_80 + 1;
  pcVar1 = (char *)malloc(local_80);
  if (pcVar1 == (char *)0x0) {
    if (log != 0) {
      pLVar6 = &ly_err_location()->no;
      if ((ly_err *)pLVar6 == (ly_err *)0x0) {
        pLVar6 = &ly_errno_int;
      }
      ((ly_err *)pLVar6)->no = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
    }
  }
  else {
    expr_00 = lyxp_parse_expr(expr);
    if (expr_00 != (lyxp_expr *)0x0) {
      if (expr_00->used == 0) {
        local_58 = (char *)0x0;
      }
      else {
        uVar16 = 0;
        local_58 = (char *)0x0;
        do {
          pcVar13 = expr_00->expr + expr_00->expr_pos[uVar16];
          if ((uVar16 != 0) &&
             (uVar9 = (int)uVar16 - 1,
             pcVar10 = expr_00->expr +
                       (ulong)expr_00->tok_len[uVar9] + (ulong)expr_00->expr_pos[uVar9],
             pcVar10 != pcVar13)) {
            strncpy(pcVar1 + (long)local_58,pcVar10,(long)pcVar13 - (long)pcVar10);
            local_58 = local_58 + ((long)pcVar13 - (long)pcVar10);
          }
          if (expr_00->tokens[uVar16] == LYXP_TOKEN_LITERAL) {
            cVar8 = *pcVar13;
            pcVar10 = pcVar13;
            if (cVar8 != ':') {
              uVar9 = (uint)expr_00->tok_len[uVar16];
              pcVar11 = pcVar13;
              do {
                bVar17 = uVar9 == 0;
                uVar9 = uVar9 - 1;
                if (cVar8 == '\0') {
                  pcVar10 = (char *)0x0;
                  break;
                }
                pcVar10 = (char *)0x0;
                if (bVar17) break;
                cVar8 = pcVar11[1];
                pcVar11 = pcVar11 + 1;
                pcVar10 = pcVar11;
              } while (cVar8 != ':');
            }
            if (pcVar10 == (char *)0x0) goto LAB_0010eb58;
            ppuVar4 = __ctype_b_loc();
            lVar15 = 0;
            while ((((*ppuVar4)[pcVar10[lVar15 + -1]] & 8) != 0 ||
                   ((uVar9 = (byte)pcVar10[lVar15 + -1] - 0x2d, uVar9 < 0x33 &&
                    ((0x4000000000003U >> ((ulong)uVar9 & 0x3f) & 1) != 0))))) {
              lVar15 = lVar15 + -1;
            }
            sVar12 = (long)pcVar10 - (long)pcVar13;
            pcVar11 = strndup(pcVar13,sVar12);
            if (pcVar11 == (char *)0x0) {
              if (log == 0) goto LAB_0010efb6;
              pLVar6 = &ly_err_location()->no;
joined_r0x0010ee65:
              if ((ly_err *)pLVar6 == (ly_err *)0x0) {
                pLVar6 = &ly_errno_int;
              }
              ((ly_err *)pLVar6)->no = LY_EMEM;
LAB_0010efad:
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","transform_xml2json");
LAB_0010efb6:
              free(pcVar1);
              lyxp_expr_free(expr_00);
              return (char *)0x0;
            }
            plVar2 = lyxml_get_ns(xml,pcVar11);
            free(pcVar11);
            if (plVar2 == (lyxml_ns *)0x0) {
              if (log == 0) goto LAB_0010efb6;
              ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
LAB_0010ef1c:
              ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                      "XML namespace with prefix \"%.*s\" not defined.",sVar12,pcVar13);
              goto LAB_0010efb6;
            }
            plVar3 = ly_ctx_get_module_by_ns(ctx,plVar2->value,(char *)0x0);
            if (plVar3 == (lys_module *)0x0) {
              strncpy(pcVar1 + (long)local_58,expr_00->expr + expr_00->expr_pos[uVar16],
                      (ulong)expr_00->tok_len[uVar16]);
              local_58 = local_58 + expr_00->tok_len[uVar16];
            }
            else {
              sVar5 = strlen(plVar3->name);
              local_80 = local_80 + (sVar5 - sVar12);
              pcVar11 = (char *)realloc(pcVar1,local_80);
              if (pcVar11 == (char *)0x0) {
                free(pcVar1);
                if (log == 0) {
                  pcVar1 = (char *)0x0;
                  goto LAB_0010efb6;
                }
                pLVar6 = &ly_err_location()->no;
                goto joined_r0x0010eff1;
              }
              strncpy(pcVar11 + (long)local_58,pcVar13,sVar12 + lVar15);
              local_58 = pcVar10 + (long)(local_58 + (lVar15 - (long)pcVar13));
              strcpy(pcVar11 + (long)local_58,plVar3->name);
              sVar12 = strlen(plVar3->name);
              strncpy(pcVar11 + (long)local_58 + sVar12,pcVar10,
                      ((long)pcVar13 * 2 + (long)pcVar10 * -2 + (ulong)expr_00->tok_len[uVar16]) -
                      lVar15);
              local_58 = local_58 +
                         (ulong)expr_00->tok_len[uVar16] +
                         (sVar12 - ((long)pcVar10 * 2 + (long)pcVar13 * -2 + lVar15));
              pcVar1 = pcVar11;
            }
          }
          else {
            if (expr_00->tokens[uVar16] == LYXP_TOKEN_NAMETEST) {
              cVar8 = *pcVar13;
              pcVar10 = pcVar13;
              if (cVar8 != ':') {
                uVar9 = (uint)expr_00->tok_len[uVar16];
                pcVar11 = pcVar13;
                do {
                  bVar17 = uVar9 == 0;
                  uVar9 = uVar9 - 1;
                  if (cVar8 == '\0') {
                    pcVar10 = (char *)0x0;
                    break;
                  }
                  pcVar10 = (char *)0x0;
                  if (bVar17) break;
                  cVar8 = pcVar11[1];
                  pcVar11 = pcVar11 + 1;
                  pcVar10 = pcVar11;
                } while (cVar8 != ':');
              }
              if (pcVar10 != (char *)0x0) {
                sVar12 = (long)pcVar10 - (long)pcVar13;
                pcVar11 = strndup(pcVar13,sVar12);
                if (pcVar11 == (char *)0x0) {
                  if (log == 0) goto LAB_0010efb6;
                  pLVar6 = &ly_err_location()->no;
                  goto joined_r0x0010ee65;
                }
                plVar2 = lyxml_get_ns(xml,pcVar11);
                free(pcVar11);
                if (plVar2 == (lyxml_ns *)0x0) {
                  if (log == 0) goto LAB_0010efb6;
                  ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"namespace prefix");
                  goto LAB_0010ef1c;
                }
                plVar3 = ly_ctx_get_module_by_ns(ctx,plVar2->value,(char *)0x0);
                if ((use_ctx_data_clb != 0) && (ctx->data_clb != (ly_module_data_clb)0x0)) {
                  if (plVar3 == (lys_module *)0x0) {
                    pcVar11 = plVar2->value;
                    pvVar14 = ctx->data_clb_data;
                    pcVar13 = (char *)0x0;
                    iVar7 = 0;
                  }
                  else {
                    if ((char)plVar3->field_0x40 < '\0') goto LAB_0010ed26;
                    pcVar13 = plVar3->name;
                    pcVar11 = plVar3->ns;
                    pvVar14 = ctx->data_clb_data;
                    iVar7 = 1;
                  }
                  plVar3 = (*ctx->data_clb)(ctx,pcVar13,pcVar11,iVar7,pvVar14);
                }
LAB_0010ed26:
                if (plVar3 == (lys_module *)0x0) {
                  if (log != 0) {
                    ly_vlog(LYE_XML_INVAL,LY_VLOG_XML,xml,"module namespace");
                    ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                            "Module with the namespace \"%s\" could not be found.",plVar2->value);
                  }
                  goto LAB_0010efb6;
                }
                sVar5 = strlen(plVar3->name);
                local_80 = local_80 + (sVar5 - sVar12);
                pcVar13 = (char *)realloc(pcVar1,local_80);
                if (pcVar13 == (char *)0x0) {
                  free(pcVar1);
                  if (log == 0) {
                    pcVar1 = (char *)0x0;
                    goto LAB_0010efb6;
                  }
                  pLVar6 = &ly_err_location()->no;
joined_r0x0010eff1:
                  if ((ly_err *)pLVar6 == (ly_err *)0x0) {
                    pLVar6 = &ly_errno_int;
                  }
                  ((ly_err *)pLVar6)->no = LY_EMEM;
                  pcVar1 = (char *)0x0;
                  goto LAB_0010efad;
                }
                strcpy(pcVar13 + (long)local_58,plVar3->name);
                sVar5 = strlen(plVar3->name);
                strncpy(pcVar13 + (long)(local_58 + sVar5),pcVar10,expr_00->tok_len[uVar16] - sVar12
                       );
                local_58 = local_58 + sVar5 + (expr_00->tok_len[uVar16] - sVar12);
                pcVar1 = pcVar13;
                goto LAB_0010edc8;
              }
            }
LAB_0010eb58:
            strncpy(pcVar1 + (long)local_58,expr_00->expr + expr_00->expr_pos[uVar16],
                    (ulong)expr_00->tok_len[uVar16]);
            local_58 = local_58 + expr_00->tok_len[uVar16];
          }
LAB_0010edc8:
          uVar16 = uVar16 + 1;
        } while (uVar16 < expr_00->used);
      }
      pcVar1[(long)local_58] = '\0';
      lyxp_expr_free(expr_00);
      pcVar1 = lydict_insert_zc(ctx,pcVar1);
      return pcVar1;
    }
    free(pcVar1);
  }
  return (char *)0x0;
}

Assistant:

const char *
transform_xml2json(struct ly_ctx *ctx, const char *expr, struct lyxml_elem *xml, int use_ctx_data_clb, int log)
{
    const char *end, *cur_expr, *ptr;
    char *out, *prefix;
    uint16_t i;
    size_t out_size, out_used, pref_len;
    const struct lys_module *mod;
    const struct lyxml_ns *ns;
    struct lyxp_expr *exp;

    out_size = strlen(expr) + 1;
    out = malloc(out_size);
    if (!out) {
        if (log) {
            LOGMEM;
        }
        return NULL;
    }
    out_used = 0;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        free(out);
        return NULL;
    }

    for (i = 0; i < exp->used; ++i) {
        cur_expr = &exp->expr[exp->expr_pos[i]];

        /* copy WS */
        if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
            strncpy(&out[out_used], end, cur_expr - end);
            out_used += cur_expr - end;
        }

        if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (use_ctx_data_clb && ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, NULL, ns->value, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            if (!mod) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "module namespace");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "Module with the namespace \"%s\" could not be found.", ns->value);
                }
                goto error;
            }

            /* adjust out size (it can even decrease in some strange cases) */
            out_size += strlen(mod->name) - pref_len;
            out = ly_realloc(out, out_size);
            if (!out) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }

            /* copy the model name */
            strcpy(&out[out_used], mod->name);
            out_used += strlen(mod->name);

            /* copy the rest */
            strncpy(&out[out_used], end, exp->tok_len[i] - pref_len);
            out_used += exp->tok_len[i] - pref_len;
        } else if ((exp->tokens[i] == LYXP_TOKEN_LITERAL) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
            ptr = end;
            while (isalnum(ptr[-1]) || (ptr[-1] == '_') || (ptr[-1] == '-') || (ptr[-1] == '.')) {
                --ptr;
            }

            /* get the module */
            pref_len = end - cur_expr;
            prefix = strndup(cur_expr, pref_len);
            if (!prefix) {
                if (log) {
                    LOGMEM;
                }
                goto error;
            }
            ns = lyxml_get_ns(xml, prefix);
            free(prefix);
            if (!ns) {
                if (log) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_XML, xml, "namespace prefix");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL,
                        "XML namespace with prefix \"%.*s\" not defined.", pref_len, cur_expr);
                }
                goto error;
            }
            mod = ly_ctx_get_module_by_ns(ctx, ns->value, NULL);
            if (mod) {
                /* adjust out size (it can even decrease in some strange cases) */
                out_size += strlen(mod->name) - pref_len;
                out = ly_realloc(out, out_size);
                if (!out) {
                    if (log) {
                        LOGMEM;
                    }
                    goto error;
                }

                /* copy any beginning */
                strncpy(&out[out_used], cur_expr, ptr - cur_expr);
                out_used += ptr - cur_expr;

                /* copy the model name */
                strcpy(&out[out_used], mod->name);
                out_used += strlen(mod->name);

                /* copy the rest */
                strncpy(&out[out_used], end, (exp->tok_len[i] - pref_len) - (ptr - cur_expr));
                out_used += (exp->tok_len[i] - pref_len) - (ptr - cur_expr);
            } else {
                strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                out_used += exp->tok_len[i];
            }
        } else {
            strncpy(&out[out_used], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
            out_used += exp->tok_len[i];
        }
    }
    out[out_used] = '\0';

    lyxp_expr_free(exp);
    return lydict_insert_zc(ctx, out);

error:
    free(out);
    lyxp_expr_free(exp);
    return NULL;
}